

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

void SanitizeEncoderOptions(WebPAnimEncoderOptions *enc_options)

{
  int iVar1;
  WebPAnimEncoderOptions *in_RDI;
  int kmin_limit;
  int print_warning;
  int local_c;
  
  local_c = in_RDI->verbose;
  if (in_RDI->minimize_size != 0) {
    DisableKeyframes(in_RDI);
  }
  if (in_RDI->kmax == 1) {
    in_RDI->kmin = 0;
    in_RDI->kmax = 0;
  }
  else {
    if (in_RDI->kmax < 1) {
      DisableKeyframes(in_RDI);
      local_c = 0;
    }
    if (in_RDI->kmin < in_RDI->kmax) {
      iVar1 = in_RDI->kmax / 2 + 1;
      if (((in_RDI->kmin < iVar1) && (iVar1 < in_RDI->kmax)) && (in_RDI->kmin = iVar1, local_c != 0)
         ) {
        fprintf(_stderr,"WARNING: Setting kmin = %d, so that kmin >= kmax / 2 + 1.\n",
                (ulong)(uint)in_RDI->kmin);
      }
    }
    else {
      in_RDI->kmin = in_RDI->kmax + -1;
      if (local_c != 0) {
        fprintf(_stderr,"WARNING: Setting kmin = %d, so that kmin < kmax.\n",
                (ulong)(uint)in_RDI->kmin);
      }
    }
    if ((0x1e < in_RDI->kmax - in_RDI->kmin) && (in_RDI->kmin = in_RDI->kmax + -0x1e, local_c != 0))
    {
      fprintf(_stderr,"WARNING: Setting kmin = %d, so that kmax - kmin <= %d.\n",
              (ulong)(uint)in_RDI->kmin,0x1e);
    }
  }
  return;
}

Assistant:

static void SanitizeEncoderOptions(WebPAnimEncoderOptions* const enc_options) {
  int print_warning = enc_options->verbose;

  if (enc_options->minimize_size) {
    DisableKeyframes(enc_options);
  }

  if (enc_options->kmax == 1) {  // All frames will be key-frames.
    enc_options->kmin = 0;
    enc_options->kmax = 0;
    return;
  } else if (enc_options->kmax <= 0) {
    DisableKeyframes(enc_options);
    print_warning = 0;
  }

  if (enc_options->kmin >= enc_options->kmax) {
    enc_options->kmin = enc_options->kmax - 1;
    if (print_warning) {
      fprintf(stderr, "WARNING: Setting kmin = %d, so that kmin < kmax.\n",
              enc_options->kmin);
    }
  } else {
    const int kmin_limit = enc_options->kmax / 2 + 1;
    if (enc_options->kmin < kmin_limit && kmin_limit < enc_options->kmax) {
      // This ensures that enc.keyframe + kmin >= kmax is always true. So, we
      // can flush all the frames in the 'count_since_key_frame == kmax' case.
      enc_options->kmin = kmin_limit;
      if (print_warning) {
        fprintf(stderr,
                "WARNING: Setting kmin = %d, so that kmin >= kmax / 2 + 1.\n",
                enc_options->kmin);
      }
    }
  }
  // Limit the max number of frames that are allocated.
  if (enc_options->kmax - enc_options->kmin > MAX_CACHED_FRAMES) {
    enc_options->kmin = enc_options->kmax - MAX_CACHED_FRAMES;
    if (print_warning) {
      fprintf(stderr,
              "WARNING: Setting kmin = %d, so that kmax - kmin <= %d.\n",
              enc_options->kmin, MAX_CACHED_FRAMES);
    }
  }
  assert(enc_options->kmin < enc_options->kmax);
}